

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFVerifier.cpp
# Opt level: O2

uint __thiscall
llvm::DWARFVerifier::verifyDebugNames
          (DWARFVerifier *this,DWARFSection *AccelSection,DataExtractor *StrData)

{
  uint *__return_storage_ptr__;
  uint32_t uVar1;
  DWARFObject *pDVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  raw_ostream *prVar7;
  NameIndex *NI_00;
  DWARFUnit *this_00;
  __normal_iterator<llvm::DWARFDebugInfoEntry_*,_std::vector<llvm::DWARFDebugInfoEntry,_std::allocator<llvm::DWARFDebugInfoEntry>_>_>
  _Var8;
  Error *E_00;
  DataExtractor *extraout_RDX;
  DataExtractor *StrData_00;
  DataExtractor *extraout_RDX_00;
  long lVar9;
  DWARFDebugInfoEntry *Die;
  NameIndex *NI;
  NameIndex *pNVar10;
  unit_iterator_range uVar11;
  die_iterator_range dVar12;
  undefined1 auStack_128 [8];
  DWARFDataExtractor AccelSectionData;
  DWARFDebugNames AccelTable;
  NameTableEntry NTE;
  ulong local_58;
  NameIndex *local_50;
  NameIndex *local_48;
  Error E;
  
  pDVar2 = (this->DCtx->DObj)._M_t.
           super___uniq_ptr_impl<const_llvm::DWARFObject,_std::default_delete<const_llvm::DWARFObject>_>
           ._M_t.
           super__Tuple_impl<0UL,_const_llvm::DWARFObject_*,_std::default_delete<const_llvm::DWARFObject>_>
           .super__Head_base<0UL,_const_llvm::DWARFObject_*,_false>._M_head_impl;
  iVar3 = (*pDVar2->_vptr_DWARFObject[5])(pDVar2);
  auStack_128 = (undefined1  [8])(AccelSection->Data).Data;
  AccelSectionData.super_DataExtractor.Data.Data = (char *)(AccelSection->Data).Length;
  AccelSectionData.super_DataExtractor.Data.Length._0_1_ = (undefined1)iVar3;
  AccelSectionData.super_DataExtractor.Data.Length._1_1_ = 0;
  AccelSectionData.super_DataExtractor._16_8_ = pDVar2;
  AccelSectionData.Obj = (DWARFObject *)AccelSection;
  DWARFDebugNames::DWARFDebugNames
            ((DWARFDebugNames *)&AccelSectionData.Section,(DWARFDataExtractor *)auStack_128,*StrData
            );
  raw_ostream::operator<<(this->OS,"Verifying .debug_names...\n");
  DWARFDebugNames::extract((DWARFDebugNames *)&stack0xffffffffffffffb8);
  uVar6 = (ulong)local_48 & 0xfffffffffffffffe;
  local_48 = (NameIndex *)(uVar6 != 0 | uVar6);
  if (uVar6 == 0) {
    uVar4 = verifyDebugNamesCULists(this,(DWARFDebugNames *)&AccelSectionData.Section);
    StrData_00 = extraout_RDX;
    pNVar10 = (NameIndex *)AccelTable.super_DWARFAcceleratorTable.StringSection._16_8_;
    for (lVar9 = (ulong)(uint)AccelTable.NameIndices.
                              super_SmallVectorImpl<llvm::DWARFDebugNames::NameIndex>.
                              super_SmallVectorTemplateBase<llvm::DWARFDebugNames::NameIndex,_false>
                              .
                              super_SmallVectorTemplateCommon<llvm::DWARFDebugNames::NameIndex,_void>
                              .super_SmallVectorBase.BeginX * 0x98; lVar9 != 0;
        lVar9 = lVar9 + -0x98) {
      uVar5 = verifyNameIndexBuckets(this,pNVar10,StrData_00);
      uVar4 = uVar4 + uVar5;
      pNVar10 = pNVar10 + 1;
      StrData_00 = extraout_RDX_00;
    }
    pNVar10 = (NameIndex *)AccelTable.super_DWARFAcceleratorTable.StringSection._16_8_;
    for (lVar9 = (ulong)(uint)AccelTable.NameIndices.
                              super_SmallVectorImpl<llvm::DWARFDebugNames::NameIndex>.
                              super_SmallVectorTemplateBase<llvm::DWARFDebugNames::NameIndex,_false>
                              .
                              super_SmallVectorTemplateCommon<llvm::DWARFDebugNames::NameIndex,_void>
                              .super_SmallVectorBase.BeginX * 0x98; lVar9 != 0;
        lVar9 = lVar9 + -0x98) {
      uVar5 = verifyNameIndexAbbrevs(this,pNVar10);
      uVar4 = uVar4 + uVar5;
      pNVar10 = pNVar10 + 1;
    }
    if (uVar4 == 0) {
      local_50 = (NameIndex *)
                 ((ulong)(uint)AccelTable.NameIndices.
                               super_SmallVectorImpl<llvm::DWARFDebugNames::NameIndex>.
                               super_SmallVectorTemplateBase<llvm::DWARFDebugNames::NameIndex,_false>
                               .
                               super_SmallVectorTemplateCommon<llvm::DWARFDebugNames::NameIndex,_void>
                               .super_SmallVectorBase.BeginX * 0x98 +
                 AccelTable.super_DWARFAcceleratorTable.StringSection._16_8_);
      uVar4 = 0;
      __return_storage_ptr__ = &AccelTable.CUToNameIndex.NumBuckets;
      for (pNVar10 = (NameIndex *)AccelTable.super_DWARFAcceleratorTable.StringSection._16_8_;
          pNVar10 != local_50; pNVar10 = pNVar10 + 1) {
        E.Payload._0_4_ = 1;
        uVar1 = (pNVar10->Hdr).super_HeaderPOD.NameCount;
        local_48 = pNVar10;
        while ((local_48 != pNVar10 || ((int)E.Payload != uVar1 + 1))) {
          DWARFDebugNames::NameIterator::operator*
                    ((NameTableEntry *)__return_storage_ptr__,
                     (NameIterator *)&stack0xffffffffffffffb8);
          uVar5 = verifyNameIndexEntries(this,pNVar10,(NameTableEntry *)__return_storage_ptr__);
          uVar4 = uVar4 + uVar5;
          DWARFDebugNames::NameIterator::next((NameIterator *)&stack0xffffffffffffffb8);
        }
      }
      if (uVar4 == 0) {
        uVar11 = DWARFContext::info_section_units(this->DCtx);
        uVar4 = 0;
        while( true ) {
          NTE.EntryOffset = (uint64_t)uVar11.end_iterator;
          pNVar10 = (NameIndex *)uVar11.begin_iterator;
          if (pNVar10 == (NameIndex *)NTE.EntryOffset) break;
          NI_00 = DWARFDebugNames::getCUNameIndex
                            ((DWARFDebugNames *)&AccelSectionData.Section,
                             (uint64_t)
                             (((pNVar10->Abbrevs).
                               super_DenseSetImpl<llvm::DWARFDebugNames::Abbrev,_llvm::DenseMap<llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>,_llvm::DWARFDebugNames::AbbrevMapInfo>
                               .TheMap.Buckets)->key).Attributes.
                             super__Vector_base<llvm::DWARFDebugNames::AttributeEncoding,_std::allocator<llvm::DWARFDebugNames::AttributeEncoding>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if (NI_00 != (NameIndex *)0x0) {
            local_50 = pNVar10;
            this_00 = &cast<llvm::DWARFCompileUnit,llvm::DWARFUnit>
                                 ((DWARFUnit *)
                                  (pNVar10->Abbrevs).
                                  super_DenseSetImpl<llvm::DWARFDebugNames::Abbrev,_llvm::DenseMap<llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>,_llvm::DWARFDebugNames::AbbrevMapInfo>
                                  .TheMap.Buckets)->super_DWARFUnit;
            dVar12 = DWARFUnit::dies(this_00);
            for (_Var8 = dVar12.begin_iterator._M_current; pNVar10 = local_50,
                _Var8._M_current != dVar12.end_iterator._M_current._M_current;
                _Var8._M_current = _Var8._M_current + 1) {
              AccelTable.CUToNameIndex._16_8_ = this_00;
              uVar5 = verifyNameIndexCompleteness
                                (this,(DWARFDie *)&AccelTable.CUToNameIndex.NumBuckets,NI_00);
              uVar4 = uVar4 + uVar5;
            }
          }
          uVar11.end_iterator =
               (unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_> *)NTE.EntryOffset
          ;
          uVar11.begin_iterator =
               (unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_> *)
               &(pNVar10->Abbrevs).
                super_DenseSetImpl<llvm::DWARFDebugNames::Abbrev,_llvm::DenseMap<llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>,_llvm::DWARFDebugNames::AbbrevMapInfo>
                .TheMap.NumEntries;
        }
      }
    }
  }
  else {
    prVar7 = error(this);
    local_58 = (ulong)local_48 | 1;
    local_48 = (NameIndex *)0x0;
    toString_abi_cxx11_((string *)&AccelTable.CUToNameIndex.NumBuckets,(llvm *)&local_58,E_00);
    prVar7 = raw_ostream::operator<<(prVar7,(string *)&AccelTable.CUToNameIndex.NumBuckets);
    raw_ostream::operator<<(prVar7,'\n');
    std::__cxx11::string::~string((string *)&AccelTable.CUToNameIndex.NumBuckets);
    if ((long *)(local_58 & 0xfffffffffffffffe) != (long *)0x0) {
      (**(code **)(*(long *)(local_58 & 0xfffffffffffffffe) + 8))();
    }
    if ((long *)((ulong)local_48 & 0xfffffffffffffffe) != (long *)0x0) {
      (**(code **)(*(long *)((ulong)local_48 & 0xfffffffffffffffe) + 8))();
    }
    uVar4 = 1;
  }
  DWARFDebugNames::~DWARFDebugNames((DWARFDebugNames *)&AccelSectionData.Section);
  return uVar4;
}

Assistant:

unsigned DWARFVerifier::verifyDebugNames(const DWARFSection &AccelSection,
                                         const DataExtractor &StrData) {
  unsigned NumErrors = 0;
  DWARFDataExtractor AccelSectionData(DCtx.getDWARFObj(), AccelSection,
                                      DCtx.isLittleEndian(), 0);
  DWARFDebugNames AccelTable(AccelSectionData, StrData);

  OS << "Verifying .debug_names...\n";

  // This verifies that we can read individual name indices and their
  // abbreviation tables.
  if (Error E = AccelTable.extract()) {
    error() << toString(std::move(E)) << '\n';
    return 1;
  }

  NumErrors += verifyDebugNamesCULists(AccelTable);
  for (const auto &NI : AccelTable)
    NumErrors += verifyNameIndexBuckets(NI, StrData);
  for (const auto &NI : AccelTable)
    NumErrors += verifyNameIndexAbbrevs(NI);

  // Don't attempt Entry validation if any of the previous checks found errors
  if (NumErrors > 0)
    return NumErrors;
  for (const auto &NI : AccelTable)
    for (DWARFDebugNames::NameTableEntry NTE : NI)
      NumErrors += verifyNameIndexEntries(NI, NTE);

  if (NumErrors > 0)
    return NumErrors;

  for (const std::unique_ptr<DWARFUnit> &U : DCtx.compile_units()) {
    if (const DWARFDebugNames::NameIndex *NI =
            AccelTable.getCUNameIndex(U->getOffset())) {
      auto *CU = cast<DWARFCompileUnit>(U.get());
      for (const DWARFDebugInfoEntry &Die : CU->dies())
        NumErrors += verifyNameIndexCompleteness(DWARFDie(CU, &Die), *NI);
    }
  }
  return NumErrors;
}